

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-types.cc
# Opt level: O1

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
tinyusdz::value::TryGetTypeName_abi_cxx11_
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,value *this,uint32_t tyid)

{
  undefined8 *puVar1;
  compare_key_type compare_key;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  uint *__dest;
  string s;
  map<mapbox::eternal::impl::element<unsigned_int,_mapbox::eternal::string>,_57UL> tynamemap;
  allocator local_3c9;
  undefined8 *local_3c8;
  undefined8 local_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  uint local_3a8 [228];
  
  __dest = local_3a8;
  memcpy(__dest,&DAT_0029ec70,0x390);
  uVar2 = (uint)this & 0xffefffff;
  uVar5 = 0x39;
  do {
    uVar3 = uVar5 >> 1;
    uVar4 = uVar3;
    if (__dest[uVar3 * 4] < uVar2) {
      uVar4 = ~uVar3 + uVar5;
      __dest = __dest + uVar3 * 4 + 4;
    }
    uVar5 = uVar4;
  } while (uVar4 != 0);
  if ((__dest == (uint *)&stack0xffffffffffffffe8) || (uVar2 < *__dest)) {
    __dest = (uint *)&stack0xffffffffffffffe8;
  }
  if (__dest == (uint *)&stack0xffffffffffffffe8) {
    __return_storage_ptr__->has_value_ = false;
    *(undefined8 *)&__return_storage_ptr__->contained = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x10) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x18) = 0;
  }
  else {
    std::__cxx11::string::string((string *)&local_3c8,*(char **)(__dest + 2),&local_3c9);
    if (((uint)this >> 0x14 & 1) != 0) {
      std::__cxx11::string::append((char *)&local_3c8);
    }
    __return_storage_ptr__->has_value_ = true;
    puVar1 = (undefined8 *)((long)&__return_storage_ptr__->contained + 0x10);
    *(undefined8 **)&__return_storage_ptr__->contained = puVar1;
    if (local_3c8 == &local_3b8) {
      *puVar1 = local_3b8;
      *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x18) = uStack_3b0;
    }
    else {
      *(undefined8 **)&__return_storage_ptr__->contained = local_3c8;
      *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x10) = local_3b8;
    }
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 8) = local_3c0;
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<std::string> TryGetTypeName(uint32_t tyid) {
  MAPBOX_ETERNAL_CONSTEXPR const auto tynamemap =
      mapbox::eternal::map<uint32_t, mapbox::eternal::string>({
          {TYPE_ID_TOKEN, kToken},
          {TYPE_ID_STRING, kString},
          {TYPE_ID_STRING, kPath},
          {TYPE_ID_ASSET_PATH, kAssetPath},
          {TYPE_ID_DICT, kDictionary},
          {TYPE_ID_TIMECODE, kTimeCode},
          {TYPE_ID_BOOL, kBool},
          {TYPE_ID_UCHAR, kUChar},
          {TYPE_ID_HALF, kHalf},
          {TYPE_ID_INT32, kInt},
          {TYPE_ID_UINT32, kUInt},
          {TYPE_ID_INT64, kInt64},
          {TYPE_ID_UINT64, kUInt64},
          {TYPE_ID_INT2, kInt2},
          {TYPE_ID_INT3, kInt3},
          {TYPE_ID_INT4, kInt4},
          {TYPE_ID_UINT2, kUInt2},
          {TYPE_ID_UINT3, kUInt3},
          {TYPE_ID_UINT4, kUInt4},
          {TYPE_ID_HALF2, kHalf2},
          {TYPE_ID_HALF3, kHalf3},
          {TYPE_ID_HALF4, kHalf4},
          {TYPE_ID_MATRIX2D, kMatrix2d},
          {TYPE_ID_MATRIX3D, kMatrix3d},
          {TYPE_ID_MATRIX4D, kMatrix4d},
          {TYPE_ID_FLOAT, kFloat},
          {TYPE_ID_FLOAT2, kFloat2},
          {TYPE_ID_FLOAT3, kFloat3},
          {TYPE_ID_FLOAT4, kFloat4},
          {TYPE_ID_DOUBLE, kDouble},
          {TYPE_ID_DOUBLE2, kDouble2},
          {TYPE_ID_DOUBLE3, kDouble3},
          {TYPE_ID_DOUBLE4, kDouble4},
          {TYPE_ID_QUATH, kQuath},
          {TYPE_ID_QUATF, kQuatf},
          {TYPE_ID_QUATD, kQuatd},
          {TYPE_ID_VECTOR3H, kVector3h},
          {TYPE_ID_VECTOR3F, kVector3f},
          {TYPE_ID_VECTOR3D, kVector3d},
          {TYPE_ID_POINT3H, kPoint3h},
          {TYPE_ID_POINT3F, kPoint3f},
          {TYPE_ID_POINT3D, kPoint3d},
          {TYPE_ID_NORMAL3H, kNormal3h},
          {TYPE_ID_NORMAL3F, kNormal3f},
          {TYPE_ID_NORMAL3D, kNormal3d},
          {TYPE_ID_COLOR3F, kColor3f},
          {TYPE_ID_COLOR3D, kColor3d},
          {TYPE_ID_COLOR4F, kColor4f},
          {TYPE_ID_COLOR4D, kColor4d},
          {TYPE_ID_FRAME4D, kFrame4d},
          {TYPE_ID_TEXCOORD2H, kTexCoord2h},
          {TYPE_ID_TEXCOORD2F, kTexCoord2f},
          {TYPE_ID_TEXCOORD2D, kTexCoord2d},
          {TYPE_ID_TEXCOORD3H, kTexCoord3h},
          {TYPE_ID_TEXCOORD3F, kTexCoord3f},
          {TYPE_ID_TEXCOORD3D, kTexCoord3d},
          {TYPE_ID_RELATIONSHIP, kRelationship},
      });

  bool array_bit = (TYPE_ID_1D_ARRAY_BIT & tyid);
  uint32_t scalar_tid = tyid & (~TYPE_ID_1D_ARRAY_BIT);

  auto ret = tynamemap.find(scalar_tid);
  if (ret != tynamemap.end()) {
    std::string s = ret->second.c_str();
    if (array_bit) {
      s += "[]";
    }
    return std::move(s);
  }

  return nonstd::nullopt;
}